

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embedding.h
# Opt level: O3

void __thiscall
Embedding<float>::backward
          (Embedding<float> *this,SentenceView *sentView,Vector<float> *grad,float lr,int cbow)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  if (cbow == 0) {
    lVar8 = (long)this->embeddingSize;
    if (0 < lVar8) {
      lVar10 = (sentView->sent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[sentView->central] * lVar8;
      pfVar6 = grad->base;
      pfVar7 = this->matrix;
      lVar9 = 0;
      do {
        pfVar7[lVar10 + lVar9] = pfVar6[lVar9] * -lr + pfVar7[lVar10 + lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
  }
  else {
    iVar1 = sentView->right;
    uVar2 = sentView->left;
    lVar8 = (long)(int)uVar2;
    if ((int)uVar2 < iVar1) {
      iVar3 = sentView->central;
      pvVar5 = sentView->sent;
      uVar4 = this->embeddingSize;
      pfVar6 = grad->base;
      pfVar7 = this->matrix;
      do {
        if (lVar8 != iVar3 && 0 < (int)uVar4) {
          lVar10 = (long)(int)uVar4 *
                   (long)(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar8];
          uVar11 = 0;
          do {
            pfVar7[lVar10 + uVar11] =
                 pfVar7[lVar10 + uVar11] - (pfVar6[uVar11] * lr) / (float)(int)(~uVar2 + iVar1);
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
  }
  return;
}

Assistant:

void Embedding<T>::backward(SentenceView &sentView, Vector<T> &grad, T lr, int cbow)
{
    int idx, base;
    if (cbow)
    {
        int C = sentView.right - sentView.left - 1;
        for (int j = sentView.left; j < sentView.right; j++)
        {
            if (j == sentView.central)
                continue;
            idx = sentView.sent[j];
            base = embeddingSize * idx;
            for (int i = 0; i < embeddingSize; i++)
                matrix[base + i] -= lr * grad.base[i] / C;
        }
    } else
    {
        idx = sentView.sent[sentView.central];
        base = embeddingSize * idx;
        for (int i = 0; i < embeddingSize; i++)
            matrix[base + i] -= lr * grad.base[i];
    }
}